

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O3

bool __thiscall
absl::debugging_internal::ElfMemImage::LookupSymbol
          (ElfMemImage *this,char *name,char *version,int type,SymbolInfo *info_out)

{
  int iVar1;
  Elf64_Word EVar2;
  SymbolIterator __begin2;
  SymbolIterator local_60;
  
  local_60.index_ = 0;
  EVar2 = 0;
  local_60.image_ = this;
  SymbolIterator::Update(&local_60,0);
  if (this->hash_ != (Elf64_Word *)0x0) {
    EVar2 = this->hash_[1];
  }
  if (((ElfMemImage *)local_60.image_ != this) || (local_60.index_ != EVar2)) {
    do {
      iVar1 = strcmp(local_60.info_.name,name);
      if (((iVar1 == 0) && (iVar1 = strcmp(local_60.info_.version,version), iVar1 == 0)) &&
         (((local_60.info_.symbol)->st_info & 0xf) == type)) {
        if (info_out == (SymbolInfo *)0x0) {
          return true;
        }
        info_out->address = local_60.info_.address;
        info_out->symbol = local_60.info_.symbol;
        info_out->name = local_60.info_.name;
        info_out->version = local_60.info_.version;
        return true;
      }
      SymbolIterator::Update(&local_60,1);
    } while (((ElfMemImage *)local_60.image_ != this) || (local_60.index_ != EVar2));
  }
  return false;
}

Assistant:

bool ElfMemImage::LookupSymbol(const char *name,
                               const char *version,
                               int type,
                               SymbolInfo *info_out) const {
  for (const SymbolInfo& info : *this) {
    if (strcmp(info.name, name) == 0 && strcmp(info.version, version) == 0 &&
        ElfType(info.symbol) == type) {
      if (info_out) {
        *info_out = info;
      }
      return true;
    }
  }
  return false;
}